

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

int __thiscall IntElemBoundsImp<0,_4,_0>::checkSatisfied(IntElemBoundsImp<0,_4,_0> *this)

{
  IntVar *pIVar1;
  int iVar2;
  int iVar3;
  
  if ((this->super_Propagator).satisfied.v == '\0') {
    iVar3 = 3;
    if (sat.assigns.data[(uint)(this->b).v] != '\0') {
      iVar2 = BoolView::getVal(&this->b);
      if ((iVar2 == 0) ||
         ((((sat.assigns.data[(uint)(this->b).v] != '\0' &&
            (pIVar1 = (this->x).var, iVar2 = (pIVar1->min).v, iVar2 == (pIVar1->max).v)) &&
           (pIVar1 = (this->y).var, (pIVar1->min).v == (pIVar1->max).v)) &&
          (pIVar1 = (this->a).data[(uint)(iVar2 + (this->x).b)].var,
          (pIVar1->min).v == (pIVar1->max).v)))) {
        Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
      }
    }
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if ((b.isFixed() && (b.getVal() == 0)) ||
				(b.isFixed() && x.isFixed() && y.isFixed() && a[static_cast<int>(x.getVal())].isFixed())) {
			satisfied = true;
		}
		return 3;
	}